

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_job_help.hh
# Opt level: O0

void add_help(QPDFArgParser *ap)

{
  QPDFArgParser *this;
  allocator<char> local_31;
  string local_30;
  QPDFArgParser *local_10;
  QPDFArgParser *ap_local;
  
  local_10 = ap;
  add_help_1(ap);
  add_help_2(local_10);
  add_help_3(local_10);
  add_help_4(local_10);
  add_help_5(local_10);
  add_help_6(local_10);
  add_help_7(local_10);
  add_help_8(local_10);
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "For detailed help, visit the qpdf manual: https://qpdf.readthedocs.io\n",&local_31);
  QPDFArgParser::addHelpFooter(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

static void add_help(QPDFArgParser& ap)
{
    add_help_1(ap);
    add_help_2(ap);
    add_help_3(ap);
    add_help_4(ap);
    add_help_5(ap);
    add_help_6(ap);
    add_help_7(ap);
    add_help_8(ap);
ap.addHelpFooter("For detailed help, visit the qpdf manual: https://qpdf.readthedocs.io\n");
}